

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O0

void sysbvm_typeAndMetatype_setFlags
               (sysbvm_context_t *context,sysbvm_tuple_t type,sysbvm_bitflags_t flags,
               sysbvm_bitflags_t metatypeFlags)

{
  sysbvm_tuple_t type_00;
  sysbvm_bitflags_t metatypeFlags_local;
  sysbvm_bitflags_t flags_local;
  sysbvm_tuple_t type_local;
  sysbvm_context_t *context_local;
  
  sysbvm_type_setFlags(context,type,flags);
  type_00 = sysbvm_tuple_getType(context,type);
  sysbvm_type_setFlags(context,type_00,metatypeFlags | 1);
  return;
}

Assistant:

SYSBVM_API void sysbvm_typeAndMetatype_setFlags(sysbvm_context_t *context, sysbvm_tuple_t type, sysbvm_bitflags_t flags, sysbvm_bitflags_t metatypeFlags)
{
    sysbvm_type_setFlags(context, type, flags);
    sysbvm_type_setFlags(context, sysbvm_tuple_getType(context, type), SYSBVM_TYPE_FLAGS_METATYPE_REQUIRED_FLAGS | metatypeFlags);
}